

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void synthesis(OpenJTalk *oj,char *txt)

{
  SpeakData *pSVar1;
  _Bool _Var2;
  size_t sampling_frequency;
  size_t size;
  short *sounddata;
  size_t local_30;
  size_t local_28;
  short *local_20;
  
  pSVar1 = g_psd;
  g_psd->sampling_frequency = 0;
  pSVar1->data = (short *)0x0;
  pSVar1->length = 0;
  if ((txt != (char *)0x0 && oj != (OpenJTalk *)0x0) && (*txt != '\0')) {
    if (g_verbose == true) {
      fprintf(_stderr,anon_var_dwarf_588,txt);
    }
    pSVar1 = g_psd;
    g_psd->sampling_frequency = 0;
    pSVar1->data = (short *)0x0;
    pSVar1->length = 0;
    _Var2 = Open_JTalk_generate_sounddata(oj->open_jtalk,txt,&local_20,&local_28,&local_30);
    pSVar1 = g_psd;
    if (_Var2) {
      g_psd->length = local_28;
      pSVar1->sampling_frequency = local_30;
      pSVar1->data = local_20;
    }
  }
  return;
}

Assistant:

void synthesis(OpenJTalk *oj, const char *txt)
{
	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;

	if (!oj)
	{
		return;
	}

	if (txt == NULL || strlen(txt) == 0)
	{
		return;
	}

	if (g_verbose)
	{
		console_message_string(u8"text： %s\n", (char*)txt);
	}

	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;

	short *sounddata;
	size_t size;
	size_t sampling_frequency;
	if (Open_JTalk_generate_sounddata(
			oj->open_jtalk,
			txt,
			&sounddata,
			&size,
			&sampling_frequency))
	{
		g_psd->length = size;
		g_psd->sampling_frequency = sampling_frequency;
		g_psd->data = sounddata;
	}
}